

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataVariableNames.cpp
# Opt level: O2

void findMetadataVariableNames(Module *module,Program *program)

{
  DIVariable *pDVar1;
  int iVar2;
  Block *pBVar3;
  Function *pFVar4;
  long lVar5;
  Expr *Val;
  ret_type pRVar6;
  ret_type pVVar7;
  DIVariable *this;
  iterator iVar8;
  mapped_type *pmVar9;
  Module *pMVar10;
  Function *block;
  unsigned_long __val;
  BasicBlock *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_01;
  BasicBlock *pBVar11;
  StringRef SVar12;
  string local_b0;
  Module *local_90;
  Module *local_88;
  Func *local_80;
  Function *local_78;
  Function *local_70;
  ret_type local_68;
  StringRef local_60;
  string name;
  
  local_90 = module + 0x18;
  pMVar10 = module + 0x20;
  while (pMVar10 = *(Module **)pMVar10, pMVar10 != local_90) {
    pFVar4 = (Function *)(pMVar10 + -0x38);
    if (pMVar10 == (Module *)0x0) {
      pFVar4 = (Function *)0x0;
    }
    local_88 = pMVar10;
    local_80 = Program::getFunction(program,pFVar4);
    local_78 = pFVar4 + 0x48;
    pFVar4 = pFVar4 + 0x50;
    while (pFVar4 = *(Function **)pFVar4, pFVar4 != local_78) {
      block = pFVar4 + -0x18;
      if (pFVar4 == (Function *)0x0) {
        block = (Function *)0x0;
      }
      local_70 = pFVar4;
      pBVar3 = Func::getBlock(local_80,(BasicBlock *)block);
      pBVar11 = (BasicBlock *)block + 0x30;
      while( true ) {
        pBVar11 = *(BasicBlock **)pBVar11;
        if (pBVar11 == (BasicBlock *)block + 0x28) break;
        this_00 = pBVar11 + -0x18;
        if (pBVar11 == (BasicBlock *)0x0) {
          this_00 = (BasicBlock *)0x0;
        }
        if ((((CallBase *)this_00)[0x10] == (CallBase)0x53) &&
           (pFVar4 = llvm::CallBase::getCalledFunction((CallBase *)this_00),
           pFVar4 != (Function *)0x0)) {
          llvm::CallBase::getCalledFunction((CallBase *)this_00);
          local_b0._0_16_ = llvm::Value::getName();
          llvm::StringRef::str_abi_cxx11_(&name,(StringRef *)&local_b0);
          iVar2 = std::__cxx11::string::compare((char *)&name);
          std::__cxx11::string::~string((string *)&name);
          if (iVar2 == 0) {
            lVar5 = *(long *)((CallBase *)this_00 +
                             -(ulong)(uint)(*(int *)((CallBase *)this_00 + 0x14) << 5));
            if (*(char *)(lVar5 + 0x10) != '\x16') {
              lVar5 = 0;
            }
            Val = Func::getExpr(pBVar3->func,*(Value **)(*(long *)(lVar5 + 0x18) + 0x80));
            pRVar6 = llvm::dyn_cast_or_null<RefExpr,Expr>(Val);
            if (pRVar6 != (ret_type)0x0) {
              Val = (pRVar6->super_UnaryExpr).expr;
            }
            pVVar7 = llvm::dyn_cast_or_null<Value,Expr>(Val);
            if (pVVar7 != (ret_type)0x0) {
              lVar5 = *(long *)((CallBase *)this_00 +
                               (0x20 - (ulong)(uint)(*(int *)((CallBase *)this_00 + 0x14) << 5)));
              if (*(char *)(lVar5 + 0x10) != '\x16') {
                lVar5 = 0;
              }
              pDVar1 = *(DIVariable **)(lVar5 + 0x18);
              this = (DIVariable *)0x0;
              if ((pDVar1 != (DIVariable *)0x0) && (this = pDVar1, *pDVar1 != (DIVariable)0x19)) {
                this = (DIVariable *)0x0;
              }
              SVar12 = llvm::DIVariable::getName(this);
              if (SVar12.Length != 0) {
                this_01 = &pBVar3->func->variableCounters;
                local_68 = pVVar7;
                local_b0._0_16_ = llvm::DIVariable::getName(this);
                llvm::StringRef::str_abi_cxx11_(&name,(StringRef *)&local_b0);
                iVar8 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(&this_01->_M_h,&name);
                std::__cxx11::string::~string((string *)&name);
                local_b0._0_16_ = llvm::DIVariable::getName(this);
                llvm::StringRef::str_abi_cxx11_(&name,(StringRef *)&local_b0);
                if (iVar8.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  local_60 = llvm::DIVariable::getName(this);
                  llvm::StringRef::str_abi_cxx11_(&local_b0,&local_60);
                  pmVar9 = std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)this_01,&local_b0);
                  *pmVar9 = 1;
                  std::__cxx11::string::~string((string *)&local_b0);
                }
                else {
                  __val = *(long *)((long)iVar8.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                          ._M_cur + 0x28) + 1;
                  *(unsigned_long *)
                   ((long)iVar8.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x28) = __val;
                  std::__cxx11::to_string(&local_b0,__val);
                  std::__cxx11::string::append((string *)&name);
                  std::__cxx11::string::~string((string *)&local_b0);
                }
                std::__cxx11::string::_M_assign((string *)&local_68->valueName);
                std::__cxx11::string::~string((string *)&name);
              }
            }
          }
        }
        pBVar11 = pBVar11 + 8;
      }
      pFVar4 = local_70 + 8;
    }
    pMVar10 = local_88 + 8;
  }
  Program::addPass(program,FindMetadataVariableNames);
  return;
}

Assistant:

void findMetadataVariableNames(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateAllocas));

    for (const auto& function : module->functions()) {
        auto* func = program.getFunction(&function);
        for (const auto& block : function) {
            auto* myBlock = func->getBlock(&block);

            for (const auto& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Call) {
                    const llvm::CallInst* CI = llvm::cast<llvm::CallInst>(&ins);
                    if (CI->getCalledFunction()) {
                        if (CI->getCalledFunction()->getName().str().compare("llvm.dbg.declare") == 0) {
                            setMetadataInfo(CI, myBlock);
                        }
                    }
                }
            }

        }
    }

    program.addPass(PassType::FindMetadataVariableNames);
}